

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remaxRow(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_row,int len)

{
  Dring *pDVar1;
  fpclass_type *pfVar2;
  fpclass_type *pfVar3;
  int iVar4;
  Dring *pDVar5;
  Dring *pDVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  fpclass_type *pfVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  fpclass_type *pfVar16;
  int *piVar17;
  byte bVar18;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> cStack_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar18 = 0;
  if ((U *)(this->u).row.elem[p_row].next == &this->u) {
    iVar8 = len - (this->u).row.max[p_row];
    if ((this->u).row.size - (this->u).row.used < iVar8) {
      packRows(this);
      iVar8 = len - (this->u).row.max[p_row];
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&cStack_1b8,(long)(this->u).row.used,(type *)0x0);
      if (&local_138 != &(this->rowMemMult).m_backend) {
        pnVar13 = &this->rowMemMult;
        pcVar12 = &local_138;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar12->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + (ulong)bVar18 * -8 + 4);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
        }
        local_138.exp = (this->rowMemMult).m_backend.exp;
        local_138.neg = (this->rowMemMult).m_backend.neg;
        local_138.fpclass = (this->rowMemMult).m_backend.fpclass;
        local_138.prec_elem = (this->rowMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_138,&cStack_1b8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&cStack_1b8,(long)len,(type *)0x0);
      pcVar12 = &local_138;
      pcVar15 = &local_b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar15->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar18 * -8 + 4);
      }
      local_b0.exp = local_138.exp;
      local_b0.neg = local_138.neg;
      local_b0.fpclass = local_138.fpclass;
      local_b0.prec_elem = local_138.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_b0,&cStack_1b8);
      if (local_b0.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&cStack_1b8,(long)(this->u).row.size,(type *)0x0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&cStack_1b8);
        if (0 < iVar9) {
          minRowMem(this,len + (this->u).row.used * 2);
        }
      }
    }
    piVar17 = &(this->u).row.used;
    *piVar17 = *piVar17 + iVar8;
    (this->u).row.max[p_row] = len;
  }
  else {
    if ((this->u).row.size - (this->u).row.used < len) {
      packRows(this);
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&cStack_1b8,(long)(this->u).row.used,(type *)0x0);
      if (&local_138 != &(this->rowMemMult).m_backend) {
        pnVar13 = &this->rowMemMult;
        pcVar12 = &local_138;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar12->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + (ulong)bVar18 * -8 + 4);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
        }
        local_138.exp = (this->rowMemMult).m_backend.exp;
        local_138.neg = (this->rowMemMult).m_backend.neg;
        local_138.fpclass = (this->rowMemMult).m_backend.fpclass;
        local_138.prec_elem = (this->rowMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_138,&cStack_1b8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&cStack_1b8,(long)len,(type *)0x0);
      pcVar12 = &local_138;
      pcVar15 = &local_b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar15->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar18 * -8 + 4);
      }
      local_b0.exp = local_138.exp;
      local_b0.neg = local_138.neg;
      local_b0.fpclass = local_138.fpclass;
      local_b0.prec_elem = local_138.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_b0,&cStack_1b8);
      if (local_b0.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&cStack_1b8,(long)(this->u).row.size,(type *)0x0);
        iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&cStack_1b8);
        if (0 < iVar8) {
          minRowMem(this,len + (this->u).row.used * 2);
        }
      }
    }
    iVar8 = (this->u).row.used;
    piVar17 = (this->u).row.start;
    iVar9 = piVar17[p_row];
    iVar4 = (this->u).row.len[p_row];
    piVar17[p_row] = iVar8;
    (this->u).row.used = iVar8 + len;
    piVar17 = (this->u).row.max;
    pDVar1 = (this->u).row.elem + p_row;
    pDVar5 = pDVar1->prev;
    piVar17[pDVar5->idx] = piVar17[pDVar5->idx] + piVar17[p_row];
    piVar17[p_row] = len;
    pDVar6 = pDVar1->next;
    pDVar6->prev = pDVar5;
    pDVar5->next = pDVar6;
    pDVar5 = (this->u).row.list.prev;
    pDVar6 = pDVar5->next;
    pDVar1->next = pDVar6;
    pDVar6->prev = pDVar1;
    pDVar1->prev = pDVar5;
    pDVar5->next = pDVar1;
    if (0 < iVar4) {
      piVar7 = (this->u).row.idx;
      pfVar16 = &(((this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).fpclass;
      piVar17 = piVar7 + iVar8;
      lVar10 = (long)iVar9;
      do {
        pfVar2 = pfVar16 + (long)iVar9 * 0x20;
        pfVar3 = pfVar16 + (long)iVar8 * 0x20 + -0x1e;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)(pfVar2 + -0x1e);
        pfVar14 = pfVar3;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *pfVar14 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
          pfVar14 = pfVar14 + (ulong)bVar18 * -2 + 1;
        }
        pfVar3[0x1c] = pfVar2[-2];
        *(bool *)(pfVar3 + 0x1d) = *(bool *)(pfVar2 + -1);
        *(undefined8 *)(pfVar3 + 0x1e) = *(undefined8 *)pfVar2;
        *piVar17 = piVar7[lVar10];
        lVar10 = lVar10 + 1;
        pfVar16 = pfVar16 + 0x20;
        piVar17 = piVar17 + 1;
      } while (lVar10 < iVar4 + iVar9);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxRow(int p_row, int len)
{
   assert(u.row.max[p_row] < len);

   if(u.row.elem[p_row].next == &(u.row.list))      /* last in row file */
   {
      int delta = len - u.row.max[p_row];

      if(delta > u.row.size - u.row.used)
      {
         packRows();
         delta = len - u.row.max[p_row];  // packRows() changes u.row.max[] !

         if(u.row.size < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len); */
      }

      assert(delta <= u.row.size - u.row.used

             && "ERROR: could not allocate memory for row file");

      u.row.used += delta;
      u.row.max[p_row] = len;
   }
   else                        /* row must be moved to end of row file */
   {
      int i, j, k;
      int* idx;
      R* val;
      Dring* ring;

      if(len > u.row.size - u.row.used)
      {
         packRows();

         if(u.row.size < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len);*/
      }

      assert(len <= u.row.size - u.row.used

             && "ERROR: could not allocate memory for row file");

      j = u.row.used;
      i = u.row.start[p_row];
      k = u.row.len[p_row] + i;
      u.row.start[p_row] = j;
      u.row.used += len;

      u.row.max[u.row.elem[p_row].prev->idx] += u.row.max[p_row];
      u.row.max[p_row] = len;
      removeDR(u.row.elem[p_row]);
      ring = u.row.list.prev;
      init2DR(u.row.elem[p_row], *ring);

      idx = u.row.idx;
      val = u.row.val.data();

      for(; i < k; ++i, ++j)
      {
         val[j] = val[i];
         idx[j] = idx[i];
      }
   }

   assert(u.row.start[u.row.list.prev->idx] + u.row.max[u.row.list.prev->idx]

          == u.row.used);
}